

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

bool __thiscall ImFont::IsGlyphRangeUnused(ImFont *this,uint c_begin,uint c_last)

{
  uint page_n;
  uint page_last;
  uint page_begin;
  uint c_last_local;
  uint c_begin_local;
  ImFont *this_local;
  
  page_n = c_begin >> 0xc;
  while( true ) {
    if (c_last >> 0xc < page_n) {
      return true;
    }
    if ((page_n >> 3 < 2) &&
       (((uint)this->Used4kPagesMap[page_n >> 3] & 1 << ((byte)page_n & 7)) != 0)) break;
    page_n = page_n + 1;
  }
  return false;
}

Assistant:

bool ImFont::IsGlyphRangeUnused(unsigned int c_begin, unsigned int c_last)
{
    unsigned int page_begin = (c_begin / 4096);
    unsigned int page_last = (c_last / 4096);
    for (unsigned int page_n = page_begin; page_n <= page_last; page_n++)
        if ((page_n >> 3) < sizeof(Used4kPagesMap))
            if (Used4kPagesMap[page_n >> 3] & (1 << (page_n & 7)))
                return false;
    return true;
}